

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::ExpectFileContent
          (CommandLineInterfaceTester *this,string_view filename,string_view content)

{
  undefined8 this_00;
  Nonnull<const_char_*> failure_msg;
  char *message;
  size_type in_R9;
  string_view s;
  FixedMapping replacements;
  string file_contents;
  string path;
  internal local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [32];
  string local_a8;
  string local_78;
  undefined1 local_58 [48];
  
  local_58._8_8_ = filename._M_str;
  local_58._0_8_ = filename._M_len;
  local_a8._M_string_length = (size_type)(this->temp_directory_)._M_dataplus._M_p;
  local_a8._M_dataplus._M_p = (pointer)(this->temp_directory_)._M_string_length;
  local_d8._0_8_ = (StatusRep *)0x1;
  local_d8._8_8_ = (long)"/../" + 3;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_78,(lts_20250127 *)(local_c8 + 0x20),(AlphaNum *)local_d8,(AlphaNum *)local_58,
             (AlphaNum *)local_d8);
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  File::ReadFileToString((File *)local_d8,&local_78,(string *)(local_c8 + 0x20),false);
  this_00 = local_d8._0_8_;
  if ((StatusRep *)local_d8._0_8_ == (StatusRep *)0x1) {
    local_58._0_8_ = &DAT_00000007;
    local_58._8_8_ = "$tmpdir";
    local_58._24_8_ = (this->temp_directory_)._M_dataplus._M_p;
    local_58._16_8_ = (this->temp_directory_)._M_string_length;
    s._M_str = local_58;
    s._M_len = (size_t)content._M_str;
    replacements._M_len = in_R9;
    replacements._M_array = (iterator)0x1;
    absl::lts_20250127::StrReplaceAll_abi_cxx11_
              ((string *)local_d8,(lts_20250127 *)content._M_len,s,replacements);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              (local_e8,"absl::StrReplaceAll(content, {{\"$tmpdir\", temp_directory_}})",
               "file_contents",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_c8 + 0x20));
    if ((StatusRep *)local_d8._0_8_ != (StatusRep *)local_c8) {
      operator_delete((void *)local_d8._0_8_,local_c8._0_8_ + 1);
    }
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_d8);
      if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = anon_var_dwarf_a22956 + 5;
      }
      else {
        message = (local_e0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
                 ,0xb8,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)local_d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
      if ((StatusRep *)local_d8._0_8_ != (StatusRep *)0x0) {
        (**(code **)(*(long *)local_d8._0_8_ + 8))();
      }
    }
    if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e0,local_e0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                          ((Nonnull<const_absl::Status_*>)local_d8,
                           "File::GetContents(path, &file_contents, true) is OK");
  if ((this_00 & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)this_00);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
             ,0xb5,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_d8);
}

Assistant:

void CommandLineInterfaceTester::ExpectFileContent(absl::string_view filename,
                                                   absl::string_view content) {
  std::string path = absl::StrCat(temp_directory_, "/", filename);
  std::string file_contents;
  ABSL_CHECK_OK(File::GetContents(path, &file_contents, true));

  EXPECT_EQ(absl::StrReplaceAll(content, {{"$tmpdir", temp_directory_}}),
            file_contents);
}